

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O2

void drawnumber_vis(t_gobj *z,_glist *glist,t_word *data,t_template *template,t_float basex,
                   t_float basey,int vis)

{
  uint uVar1;
  int iVar2;
  int zoom;
  _glist *p_Var3;
  undefined4 extraout_var;
  t_float tVar4;
  t_float tVar5;
  t_float tVar6;
  char *tags [2];
  char tag [80];
  t_atom fontatoms [3];
  char buf [1024];
  
  tags[0] = tag;
  tags[1] = "label";
  if (vis == 0) {
    iVar2 = sprintf(tag,"drawnumber%lx",data);
    p_Var3 = glist_getcanvas((_glist *)CONCAT44(extraout_var,iVar2));
    pdgui_vmess((char *)0x0,"crs",p_Var3,"delete",tag);
  }
  else {
    tVar4 = fielddesc_getfloat((_fielddesc *)(z + 0xb),template,data,0);
    if ((tVar4 != 0.0) || (NAN(tVar4))) {
      sprintf(tag,"drawnumber%lx",data);
      tVar4 = fielddesc_getcoord((_fielddesc *)&z[3].g_next,template,data,0);
      tVar4 = glist_xtopixels(glist,tVar4 + basex);
      tVar5 = fielddesc_getcoord((_fielddesc *)(z + 6),template,data,0);
      tVar5 = glist_ytopixels(glist,tVar5 + basey);
      tVar6 = fielddesc_getfloat((_fielddesc *)&z[8].g_next,template,data,1);
      uVar1 = numbertocolor((int)tVar6);
      drawnumber_getbuf((t_drawnumber *)z,data,template,buf);
      fontatoms[0].a_type = A_SYMBOL;
      fontatoms[0].a_w.w_symbol = gensym(sys_font);
      fontatoms[1].a_type = A_FLOAT;
      iVar2 = glist_getfont(glist);
      zoom = glist_getzoom(glist);
      iVar2 = sys_hostfontsize(iVar2,zoom);
      fontatoms[1].a_w._0_4_ = (undefined4)-iVar2;
      fontatoms[2].a_type = A_SYMBOL;
      fontatoms[2].a_w.w_symbol = gensym(sys_fontweight);
      p_Var3 = glist_getcanvas((_glist *)fontatoms[2].a_w.w_symbol);
      pdgui_vmess((char *)0x0,"crr ii rs rk rs rA rS",p_Var3,"create","text",(ulong)(uint)(int)tVar4
                  ,(ulong)(uint)(int)tVar5,"-anchor","nw","-fill",(ulong)uVar1,"-text",buf,"-font",3
                  ,fontatoms,"-tags",2,tags);
    }
  }
  return;
}

Assistant:

static void drawnumber_vis(t_gobj *z, t_glist *glist,
    t_word *data, t_template *template, t_float basex, t_float basey,
    int vis)
{
    t_drawnumber *x = (t_drawnumber *)z;
    char tag[80];
    const char*tags[] = {tag, "label"};

        /* see comment in plot_vis() */
    if (vis && !fielddesc_getfloat(&x->x_vis, template, data, 0))
        return;
    sprintf(tag, "drawnumber%lx", data);
    if (vis)
    {
        t_atom fontatoms[3];
        t_atom at;
        int xloc = glist_xtopixels(glist,
            basex + fielddesc_getcoord(&x->x_xloc, template, data, 0));
        int yloc = glist_ytopixels(glist,
            basey + fielddesc_getcoord(&x->x_yloc, template, data, 0));
        char buf[DRAWNUMBER_BUFSIZE];
        int color = numbertocolor(
            fielddesc_getfloat(&x->x_color, template, data, 1));
        drawnumber_getbuf(x, data, template, buf);

        SETSYMBOL(fontatoms+0, gensym(sys_font));
        SETFLOAT (fontatoms+1,-sys_hostfontsize(glist_getfont(glist), glist_getzoom(glist)));
        SETSYMBOL(fontatoms+2, gensym(sys_fontweight));
        pdgui_vmess(0, "crr ii rs rk rs rA rS",
            glist_getcanvas(glist), "create", "text",
            xloc, yloc,
            "-anchor", "nw",
            "-fill", color,
            "-text", buf,
            "-font", 3, fontatoms,
            "-tags", 2, tags);
    }
    else
        pdgui_vmess(0, "crs", glist_getcanvas(glist), "delete", tag);
}